

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O3

torrent_handle __thiscall
libtorrent::peer_connection_handle::associated_torrent(peer_connection_handle *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar7;
  torrent_handle tVar8;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0027eb60:
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar5 = this_00->_M_use_count;
    do {
      if (iVar5 == 0) goto LAB_0027eb60;
      LOCK();
      iVar2 = this_00->_M_use_count;
      bVar7 = iVar5 == iVar2;
      if (bVar7) {
        this_00->_M_use_count = iVar5 + 1;
        iVar2 = iVar5;
      }
      iVar5 = iVar2;
      UNLOCK();
    } while (!bVar7);
    lVar3 = *in_RSI;
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71((int7)((ulong)in_RDX._M_pi >> 8),lVar3 != 0);
    if (this_00->_M_use_count != 0 && lVar3 != 0) {
      p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x18);
      if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0027ebef:
        (this->m_connection).
        super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (this->m_connection).
        super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        in_RDX._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x10);
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
        }
        iVar5 = p_Var4->_M_use_count;
        do {
          if (iVar5 == 0) {
            p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            goto LAB_0027ebb8;
          }
          LOCK();
          iVar2 = p_Var4->_M_use_count;
          bVar7 = iVar5 == iVar2;
          if (bVar7) {
            p_Var4->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
        } while (!bVar7);
        p_Var6 = in_RDX._M_pi;
        this_01 = p_Var4;
        if (p_Var4->_M_use_count == 0) {
          in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
LAB_0027ebb8:
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &p_Var4->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = p_Var4->_M_weak_count;
          p_Var4->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*p_Var4->_vptr__Sp_counted_base[3])();
          in_RDX._M_pi = extraout_RDX_00;
        }
        if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0027ebef;
        tVar8 = aux::torrent::get_handle((torrent *)this);
        in_RDX._M_pi = tVar8.m_torrent.
                       super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        in_RDX._M_pi = extraout_RDX_01;
      }
      goto LAB_0027eb69;
    }
  }
  (this->m_connection).
  super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_connection).
  super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0027eb69:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    in_RDX._M_pi = extraout_RDX;
  }
  tVar8.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = in_RDX._M_pi;
  tVar8.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (torrent_handle)
         tVar8.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

torrent_handle peer_connection_handle::associated_torrent() const
{
	std::shared_ptr<aux::peer_connection> pc = native_handle();
	if (!pc) return torrent_handle();
	auto t = pc->associated_torrent().lock();
	if (!t) return torrent_handle();
	return t->get_handle();
}